

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

int __thiscall MeCab::EncoderFeatureIndex::id(EncoderFeatureIndex *this,char *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  ulong uVar3;
  allocator local_71;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  char local_60 [8];
  undefined8 uStack_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  std::__cxx11::string::string((string *)&local_50,key,(allocator *)&local_70);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->dic_)._M_t,&local_50.first);
  paVar1 = &local_50.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar2._M_node == &(this->dic_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&local_70,key,&local_71);
    if (local_70 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60) {
      local_50.first.field_2._8_8_ = uStack_58;
      local_50.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_50.first._M_dataplus._M_p = (pointer)local_70;
    }
    local_50.first._M_string_length = local_68;
    local_68 = 0;
    local_60[0] = '\0';
    local_50.second = (int)(this->super_FeatureIndex).maxid_;
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_60;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->dic_,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p);
    }
    if (local_70 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60) {
      operator_delete(local_70);
    }
    uVar3 = (this->super_FeatureIndex).maxid_;
    (this->super_FeatureIndex).maxid_ = uVar3 + 1;
  }
  else {
    uVar3 = (ulong)iVar2._M_node[2]._M_color;
  }
  return (int)uVar3;
}

Assistant:

int EncoderFeatureIndex::id(const char *key) {
  std::map<std::string, int>::const_iterator it = dic_.find(key);
  if (it == dic_.end()) {
    dic_.insert(std::pair<std::string, int>(std::string(key), maxid_));
    return maxid_++;
  } else {
    return it->second;
  }
  return -1;
}